

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

TypeIDHelper NULLC::Typeid(NULLCRef r)

{
  ExternTypeInfo *pEVar1;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  uint local_c;
  TypeIDHelper help;
  
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  if ((pEVar1->typeFlags & 4) == 0) {
    local_c = in_stack_00000008;
  }
  else {
    local_c = *(uint *)CONCAT124(r,in_stack_0000000c);
  }
  return (TypeIDHelper)local_c;
}

Assistant:

NULLC::TypeIDHelper NULLC::Typeid(NULLCRef r)
{
	TypeIDHelper help;

	if(linker->exTypes[r.typeID].typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE)
		help.id = *(int*)r.ptr;
	else
		help.id = r.typeID;

	return help;
}